

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O0

token * __thiscall lightconf::scanner::cur_token(token *__return_storage_ptr__,scanner *this)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  scanner *this_local;
  token *tok;
  
  uVar1 = this->cur_token_;
  sVar2 = std::vector<lightconf::token,_std::allocator<lightconf::token>_>::size(&this->tokens_);
  if (uVar1 == sVar2) {
    token::token(__return_storage_ptr__,none_token);
    __return_storage_ptr__->type = eof_token;
  }
  else {
    pvVar3 = std::vector<lightconf::token,_std::allocator<lightconf::token>_>::operator[]
                       (&this->tokens_,(ulong)this->cur_token_);
    token::token(__return_storage_ptr__,pvVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

inline token scanner::cur_token() const {
    if (cur_token_ == tokens_.size()) {
        token tok;
        tok.type = token_type::eof_token;
        return tok;
    }
    return tokens_[cur_token_];
}